

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder.cpp
# Opt level: O0

void __thiscall encoder_rate_adapt_demo_Test::TestBody(encoder_rate_adapt_demo_Test *this)

{
  size_type sVar1;
  void *this_00;
  undefined1 local_2418 [8];
  array<bool,_1024UL> ratead_synd;
  size_t rate_adaption_steps;
  array<bool,_2048UL> syndrome;
  array<bool,_6144UL> input;
  encoder_rate_adapt_demo_Test *this_local;
  
  memset(syndrome._M_elems + 0x7f8,0,0x1800);
  syndrome._M_elems[0x7f8] = true;
  syndrome._M_elems[0x7f9] = true;
  syndrome._M_elems[0x7fa] = true;
  syndrome._M_elems[0x7fb] = true;
  memset(&rate_adaption_steps,0,0x800);
  ratead_synd._M_elems[0x3f8] = false;
  ratead_synd._M_elems[0x3f9] = true;
  ratead_synd._M_elems[0x3fa] = false;
  ratead_synd._M_elems[0x3fb] = false;
  ratead_synd._M_elems[0x3fc] = false;
  ratead_synd._M_elems[0x3fd] = false;
  ratead_synd._M_elems[0x3fe] = false;
  ratead_synd._M_elems[0x3ff] = false;
  memset(local_2418,0,0x400);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  HelpersForTests::print_nz_inds<std::array<bool,6144ul>>
            ((array<bool,_6144UL> *)(syndrome._M_elems + 0x7f8));
  LDPC4QKD::encode<bool>
            ((array<bool,_6144UL> *)(syndrome._M_elems + 0x7f8),
             (array<bool,_2048UL> *)&rate_adaption_steps);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  HelpersForTests::print_nz_inds<std::array<bool,2048ul>>
            ((array<bool,_2048UL> *)&rate_adaption_steps);
  LDPC4QKD::rate_adapt<bool,1024ul>
            ((array<bool,_2048UL> *)&rate_adaption_steps,(array<bool,_1024UL> *)local_2418);
  std::operator<<((ostream *)&std::cout,"------------------------\n");
  HelpersForTests::print_nz_inds<std::array<bool,1024ul>>((array<bool,_1024UL> *)local_2418);
  sVar1 = std::array<bool,_1024UL>::size((array<bool,_1024UL> *)local_2418);
  this_00 = (void *)std::ostream::operator<<(&std::cout,sVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

TEST(encoder, rate_adapt_demo) {
    std::array<Bit, AutogenLDPC::N> input{
        1,1,1,1,0,0,0,0,1,1};
    std::array<Bit, AutogenLDPC::M> syndrome{};
    constexpr std::size_t rate_adaption_steps = AutogenRateAdapt::rows.size() / 2;
    std::array<Bit, AutogenLDPC::M - rate_adaption_steps> ratead_synd{};
//    vec_to_arr<Bit, AutogenLDPC::N>(get_bitstring(AutogenLDPC::N), input);

    std::cout << "------------------------\n";
    print_nz_inds(input);

    encode(input, syndrome);

    std::cout << "------------------------\n";
    print_nz_inds(syndrome);

    rate_adapt(syndrome, ratead_synd);

    std::cout << "------------------------\n";
    print_nz_inds(ratead_synd);
    std::cout << ratead_synd.size() << std::endl;
}